

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O3

int Saig_ManPhaseFrameNum(Aig_Man_t *p,Vec_Int_t *vInits)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  Saig_Tsim_t *p_00;
  int iVar3;
  
  if (p->nRegs == 0) {
    __assert_fail("Saig_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0x34d,"int Saig_ManPhaseFrameNum(Aig_Man_t *, Vec_Int_t *)");
  }
  if (p->nTruePis != 0) {
    if (p->nTruePos == 0) {
      __assert_fail("Saig_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                    ,0x34f,"int Saig_ManPhaseFrameNum(Aig_Man_t *, Vec_Int_t *)");
    }
    p_00 = Saig_ManReachableTernary(p,vInits,0);
    if (p_00 == (Saig_Tsim_t *)0x0) {
      iVar3 = 1;
    }
    else {
      pVVar1 = p_00->vStates;
      if ((long)pVVar1->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
      }
      uVar2 = Saig_TsiComputePrefix
                        (p_00,(uint *)pVVar1->pArray[(long)pVVar1->nSize + -1],p_00->nWords);
      iVar3 = ~uVar2 + pVVar1->nSize;
      Saig_TsiStop(p_00);
    }
    return iVar3;
  }
  __assert_fail("Saig_ManPiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                ,0x34e,"int Saig_ManPhaseFrameNum(Aig_Man_t *, Vec_Int_t *)");
}

Assistant:

int Saig_ManPhaseFrameNum( Aig_Man_t * p, Vec_Int_t * vInits )
{
    Saig_Tsim_t * pTsi;
    int nFrames, nPrefix;
    assert( Saig_ManRegNum(p) );
    assert( Saig_ManPiNum(p) );
    assert( Saig_ManPoNum(p) );
    // perform terminary simulation
    pTsi = Saig_ManReachableTernary( p, vInits, 0 );
    if ( pTsi == NULL )
        return 1;
    // derive information
    nPrefix = Saig_TsiComputePrefix( pTsi, (unsigned *)Vec_PtrEntryLast(pTsi->vStates), pTsi->nWords );
    nFrames = Vec_PtrSize(pTsi->vStates) - 1 - nPrefix;
    Saig_TsiStop( pTsi );
    // potentially, may need to reduce nFrames if nPrefix is less than nFrames
    return nFrames;
}